

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopl.cpp
# Opt level: O1

void advance(FM_OPL *OPL,int loch,int hich)

{
  int *piVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  UINT32 UVar10;
  ulong uVar11;
  uint uVar12;
  
  uVar4 = OPL->eg_timer_overflow;
  uVar3 = OPL->eg_timer + OPL->eg_timer_add;
  OPL->eg_timer = uVar3;
  if (uVar4 <= uVar3) {
    uVar11 = (ulong)(uint)LFO_PM;
    UVar10 = OPL->eg_cnt;
    do {
      UVar10 = UVar10 + 1;
      uVar12 = loch * 2;
      if (loch * 2 <= hich * 2 + 1) {
        do {
          iVar5 = (int)uVar12 / 2;
          uVar8 = (ulong)((uVar12 & 1) * 0x60);
          switch(*(undefined1 *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 10)) {
          case 1:
            bVar2 = *(byte *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x20);
            if (((UVar10 & ~(-1 << (bVar2 & 0x1f))) == 0) &&
               (iVar7 = (uint)""[(ulong)(UVar10 >> (bVar2 & 0x1f) & 7) +
                                 (ulong)*(byte *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out +
                                                 uVar8 + 0x21)] +
                        *(int *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x14),
               *(int *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x14) = iVar7,
               0x1fe < iVar7)) {
              *(undefined4 *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x14) = 0x1ff;
              *(undefined1 *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 10) = 0;
            }
            break;
          case 2:
            if ((*(char *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 9) == '\0') &&
               (bVar2 = *(byte *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x20),
               (UVar10 & ~(-1 << (bVar2 & 0x1f))) == 0)) {
              iVar7 = (uint)""[(ulong)(UVar10 >> (bVar2 & 0x1f) & 7) +
                               (ulong)*(byte *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out +
                                               uVar8 + 0x21)] +
                      *(int *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x14);
              if (0x1fe < iVar7) {
                iVar7 = 0x1ff;
              }
              *(int *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x14) = iVar7;
            }
            break;
          case 3:
            bVar2 = *(byte *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x1e);
            if (((UVar10 & ~(-1 << (bVar2 & 0x1f))) == 0) &&
               (iVar7 = (uint)""[(ulong)(UVar10 >> (bVar2 & 0x1f) & 7) +
                                 (ulong)*(byte *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out +
                                                 uVar8 + 0x1f)] +
                        *(int *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x14),
               *(int *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x14) = iVar7,
               *(int *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x18) <= iVar7)) {
              *(undefined1 *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 10) = 2;
            }
            break;
          case 4:
            bVar2 = *(byte *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x1c);
            if ((UVar10 & ~(-1 << (bVar2 & 0x1f))) == 0) {
              uVar9 = *(uint *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x14);
              iVar7 = (int)((uint)""[(ulong)(UVar10 >> (bVar2 & 0x1f) & 7) +
                                     (ulong)*(byte *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out +
                                                     uVar8 + 0x1d)] * ~uVar9) >> 3;
              iVar6 = iVar7 + uVar9;
              *(int *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x14) = iVar6;
              if (iVar6 == 0 || SCARRY4(iVar7,uVar9) != iVar6 < 0) {
                *(undefined4 *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x14) = 0;
                *(undefined1 *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 10) = 3;
              }
            }
          }
          if (*(char *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + uVar8 + 0x2c) == '\0') {
LAB_003193d5:
            iVar7 = *(int *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + (uVar8 - 0x14));
          }
          else {
            uVar9 = OPL->P_CH[iVar5].block_fnum;
            if (""[(uVar9 >> 3 & 0x70) + uVar11] == '\0') goto LAB_003193d5;
            uVar9 = uVar9 + (int)""[(uVar9 >> 3 & 0x70) + uVar11];
            iVar7 = (uint)*(byte *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + (uVar8 - 0x19)) *
                    (OPL->fn_tab[uVar9 & 0x3ff] >> (~(byte)(uVar9 >> 10) & 7));
          }
          piVar1 = (int *)((long)OPL->P_CH[iVar5].SLOT[0].op1_out + (uVar8 - 0x18));
          *piVar1 = *piVar1 + iVar7;
          uVar12 = uVar12 + 1;
        } while (hich * 2 + 2U != uVar12);
      }
      uVar3 = uVar3 - uVar4;
      uVar4 = OPL->eg_timer_overflow;
    } while (uVar4 <= uVar3);
    OPL->eg_timer = uVar3;
    OPL->eg_cnt = UVar10;
  }
  return;
}

Assistant:

INLINE void advance(FM_OPL *OPL, int loch, int hich)
{
	OPL_CH *CH;
	OPL_SLOT *op;
	int i;

	OPL->eg_timer += OPL->eg_timer_add;
	loch *= 2;
	hich *= 2;

	while (OPL->eg_timer >= OPL->eg_timer_overflow)
	{
		OPL->eg_timer -= OPL->eg_timer_overflow;

		OPL->eg_cnt++;

		for (i = loch; i <= hich + 1; i++)
		{
			CH  = &OPL->P_CH[i/2];
			op  = &CH->SLOT[i&1];

			/* Envelope Generator */
			switch(op->state)
			{
			case EG_ATT:		/* attack phase */
				if ( !(OPL->eg_cnt & ((1<<op->eg_sh_ar)-1) ) )
				{
					op->volume += (~op->volume *
	                        		           (eg_inc[op->eg_sel_ar + ((OPL->eg_cnt>>op->eg_sh_ar)&7)])
        			                          ) >>3;

					if (op->volume <= MIN_ATT_INDEX)
					{
						op->volume = MIN_ATT_INDEX;
						op->state = EG_DEC;
					}

				}
			break;

			case EG_DEC:	/* decay phase */
				if ( !(OPL->eg_cnt & ((1<<op->eg_sh_dr)-1) ) )
				{
					op->volume += eg_inc[op->eg_sel_dr + ((OPL->eg_cnt>>op->eg_sh_dr)&7)];

					if ( op->volume >= (INT32)op->sl )
						op->state = EG_SUS;

				}
			break;

			case EG_SUS:	/* sustain phase */

				/* this is important behaviour:
				one can change percusive/non-percussive modes on the fly and
				the chip will remain in sustain phase - verified on real YM3812 */

				if(op->eg_type)		/* non-percussive mode */
				{
									/* do nothing */
				}
				else				/* percussive mode */
				{
					/* during sustain phase chip adds Release Rate (in percussive mode) */
					if ( !(OPL->eg_cnt & ((1<<op->eg_sh_rr)-1) ) )
					{
						op->volume += eg_inc[op->eg_sel_rr + ((OPL->eg_cnt>>op->eg_sh_rr)&7)];

						if ( op->volume >= MAX_ATT_INDEX )
							op->volume = MAX_ATT_INDEX;
					}
					/* else do nothing in sustain phase */
				}
			break;

			case EG_REL:	/* release phase */
				if ( !(OPL->eg_cnt & ((1<<op->eg_sh_rr)-1) ) )
				{
					op->volume += eg_inc[op->eg_sel_rr + ((OPL->eg_cnt>>op->eg_sh_rr)&7)];

					if ( op->volume >= MAX_ATT_INDEX )
					{
						op->volume = MAX_ATT_INDEX;
						op->state = EG_OFF;
					}

				}
			break;

			default:
			break;
			}

			/* Phase Generator */
			if(op->vib)
			{
				UINT8 block;
				unsigned int block_fnum = CH->block_fnum;

				unsigned int fnum_lfo   = (block_fnum&0x0380) >> 7;

				signed int lfo_fn_table_index_offset = lfo_pm_table[LFO_PM + 16*fnum_lfo ];

				if (lfo_fn_table_index_offset)	/* LFO phase modulation active */
				{
					block_fnum += lfo_fn_table_index_offset;
					block = (block_fnum&0x1c00) >> 10;
					op->Cnt += (OPL->fn_tab[block_fnum&0x03ff] >> (7-block)) * op->mul;
				}
				else	/* LFO phase modulation  = zero */
				{
					op->Cnt += op->Incr;
				}
			}
			else	/* LFO phase modulation disabled for this operator */
			{
				op->Cnt += op->Incr;
			}
		}
	}
}